

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_quaternary_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,uint32_t op3,char *op)

{
  uint32_t result_id_00;
  uint32_t result_type_00;
  bool bVar1;
  char (*in_stack_ffffffffffffff00) [2];
  bool local_d9;
  string local_d8;
  string local_b8;
  string local_88;
  string local_68;
  string local_48;
  bool local_25;
  uint32_t local_24;
  uint32_t uStack_20;
  bool forward;
  uint32_t op2_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  local_24 = op2;
  uStack_20 = op1;
  op2_local = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  bVar1 = should_forward(this,op0);
  local_d9 = false;
  if (bVar1) {
    bVar1 = should_forward(this,uStack_20);
    local_d9 = false;
    if (bVar1) {
      bVar1 = should_forward(this,local_24);
      local_d9 = false;
      if (bVar1) {
        local_d9 = should_forward(this,op3);
      }
    }
  }
  result_type_00 = op0_local;
  result_id_00 = op1_local;
  local_25 = local_d9;
  to_unpacked_expression_abi_cxx11_(&local_68,this,op2_local,true);
  to_unpacked_expression_abi_cxx11_(&local_88,this,uStack_20,true);
  to_unpacked_expression_abi_cxx11_(&local_b8,this,local_24,true);
  to_unpacked_expression_abi_cxx11_(&local_d8,this,op3,true);
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
            (&local_48,(diligent_spirv_cross *)&op,(char **)0xe5b075,(char (*) [2])&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf64f1c,
             (char (*) [3])&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf64f1c,
             (char (*) [3])&local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf64f1c,
             (char (*) [3])&local_d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf65f2d,
             in_stack_ffffffffffffff00);
  emit_op(this,result_type_00,result_id_00,&local_48,(bool)(local_25 & 1),false);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,op2_local);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,uStack_20);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,local_24);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,op3);
  return;
}

Assistant:

void CompilerGLSL::emit_quaternary_func_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                           uint32_t op2, uint32_t op3, const char *op)
{
	bool forward = should_forward(op0) && should_forward(op1) && should_forward(op2) && should_forward(op3);
	emit_op(result_type, result_id,
	        join(op, "(", to_unpacked_expression(op0), ", ", to_unpacked_expression(op1), ", ",
	             to_unpacked_expression(op2), ", ", to_unpacked_expression(op3), ")"),
	        forward);

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
	inherit_expression_dependencies(result_id, op3);
}